

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5c5a51::ECCurveTest_P224Bug_Test::TestBody(ECCurveTest_P224Bug_Test *this)

{
  int iVar1;
  EC_POINT *src;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<EC_POINT> ret;
  EC_SCALAR sc31;
  EC_SCALAR sc32;
  UniquePtr<BIGNUM> bn32;
  UniquePtr<BIGNUM> bn31;
  UniquePtr<EC_POINT> p;
  AssertHelper local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  AssertHelper local_c8;
  _Head_base<0UL,_ec_point_st_*,_false> local_c0;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [3];
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  _Head_base<0UL,_bignum_st_*,_false> local_28;
  _Head_base<0UL,_bignum_st_*,_false> local_20;
  _Head_base<0UL,_ec_point_st_*,_false> local_18;
  
  src = EC_GROUP_get0_generator((EC_GROUP *)(this->super_ECCurveTest).group_);
  local_18._M_head_impl =
       (ec_point_st *)EC_POINT_dup(src,(EC_GROUP *)(this->super_ECCurveTest).group_);
  local_70[0] = local_18._M_head_impl != (ec_point_st *)0x0;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18._M_head_impl == (ec_point_st *)0x0) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_70,(AssertionResult *)0x54bfec,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x396,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
    testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
  }
  else {
    iVar1 = EC_POINT_invert((EC_GROUP *)(this->super_ECCurveTest).group_,
                            (EC_POINT *)local_18._M_head_impl,(BN_CTX *)0x0);
    local_70[0] = iVar1 != 0;
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) {
      local_c0._M_head_impl =
           (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
      local_70[0] = local_c0._M_head_impl != (ec_point_st *)0x0;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_c0._M_head_impl == (ec_point_st *)0x0) {
        testing::Message::Message((Message *)local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,(internal *)local_70,(AssertionResult *)0x54c35d,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x39b,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_a8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_b8._1_7_,local_b8[0]),
                          local_a8[0]._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 8))();
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
      }
      else {
        local_20._M_head_impl = (bignum_st *)BN_new();
        local_28._M_head_impl = (bignum_st *)BN_new();
        local_70[0] = (BIGNUM *)local_20._M_head_impl != (BIGNUM *)0x0;
        local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((BIGNUM *)local_20._M_head_impl == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_b8,(internal *)local_70,(AssertionResult *)"bn31","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x39d,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
          testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
LAB_002dcb91:
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_68;
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_a8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_b8._1_7_,local_b8[0]),
                            local_a8[0]._M_allocated_capacity + 1);
          }
          local_e0 = local_68;
          if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 8))();
            local_e0 = local_68;
          }
LAB_002dcbce:
          if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
LAB_002dcbd6:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(this_00,local_e0);
          }
        }
        else {
          local_70[0] = (BIGNUM *)local_28._M_head_impl != (BIGNUM *)0x0;
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((BIGNUM *)local_28._M_head_impl == (BIGNUM *)0x0) {
            testing::Message::Message((Message *)local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_b8,(internal *)local_70,(AssertionResult *)"bn32","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x39e,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
            testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
            goto LAB_002dcb91;
          }
          iVar1 = BN_set_word((BIGNUM *)local_20._M_head_impl,0x1f);
          local_70[0] = iVar1 != 0;
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_b8,(internal *)local_70,
                       (AssertionResult *)"BN_set_word(bn31.get(), 31)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x39f,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
            testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
            goto LAB_002dcb91;
          }
          iVar1 = BN_set_word((BIGNUM *)local_28._M_head_impl,0x20);
          local_70[0] = iVar1 != 0;
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_b8,(internal *)local_70,
                       (AssertionResult *)"BN_set_word(bn32.get(), 32)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a0,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
            testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
            goto LAB_002dcb91;
          }
          pcVar2 = (char *)0x0;
          iVar1 = EC_POINT_mul((EC_GROUP *)(this->super_ECCurveTest).group_,
                               (EC_POINT *)local_c0._M_head_impl,(BIGNUM *)local_28._M_head_impl,
                               (EC_POINT *)local_18._M_head_impl,(BIGNUM *)local_20._M_head_impl,
                               (BN_CTX *)0x0);
          local_70[0] = iVar1 != 0;
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_b8,(internal *)local_70,
                       (AssertionResult *)
                       "EC_POINT_mul(group(), ret.get(), bn32.get(), p.get(), bn31.get(), nullptr)",
                       "false","true",pcVar2);
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a2,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
            testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
            goto LAB_002dcb91;
          }
          local_70._0_4_ = 0;
          local_e8._0_4_ =
               EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                            (EC_POINT *)local_c0._M_head_impl,src,(BN_CTX *)0x0);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_b8,"0","EC_POINT_cmp(group(), ret.get(), g, nullptr)",
                     (int *)local_70,(int *)local_e8);
          if (local_b8[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_70);
            if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              message = "";
            }
            else {
              message = (local_b0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a3,message);
            testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_70)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
            if ((long *)CONCAT44(local_70._4_4_,local_70._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_70._4_4_,local_70._0_4_) + 8))();
            }
          }
          if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b0,local_b0);
          }
          iVar1 = ec_bignum_to_scalar((this->super_ECCurveTest).group_,(EC_SCALAR *)local_b8,
                                      local_20._M_head_impl);
          local_100.data_._0_4_ = CONCAT31(local_100.data_._1_3_,iVar1 != 0);
          local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_e8,(internal *)&local_100,
                       (AssertionResult *)"ec_bignum_to_scalar(group(), &sc31, bn31.get())","false",
                       "true",pcVar2);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a8,(char *)CONCAT44(local_e8._4_4_,local_e8._0_4_));
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_f0);
LAB_002dceb0:
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_f8;
            testing::internal::AssertHelper::~AssertHelper(&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != &local_d8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_e8._4_4_,local_e8._0_4_),
                              local_d8._M_allocated_capacity + 1);
            }
            local_e0 = local_f8;
            if ((long *)CONCAT44(local_f0.data_._4_4_,(int)local_f0.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_f0.data_._4_4_,(int)local_f0.data_) + 8))();
              local_e0 = local_f8;
            }
            goto LAB_002dcbce;
          }
          iVar1 = ec_bignum_to_scalar((this->super_ECCurveTest).group_,(EC_SCALAR *)local_70,
                                      local_28._M_head_impl);
          local_100.data_._0_4_ = CONCAT31(local_100.data_._1_3_,iVar1 != 0);
          local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_e8,(internal *)&local_100,
                       (AssertionResult *)"ec_bignum_to_scalar(group(), &sc32, bn32.get())","false",
                       "true",pcVar2);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3a9,(char *)CONCAT44(local_e8._4_4_,local_e8._0_4_));
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_f0);
            goto LAB_002dceb0;
          }
          iVar1 = ec_point_mul_scalar_public
                            ((this->super_ECCurveTest).group_,&(local_c0._M_head_impl)->raw,
                             (EC_SCALAR *)local_70,&(local_18._M_head_impl)->raw,
                             (EC_SCALAR *)local_b8);
          local_100.data_._0_4_ = CONCAT31(local_100.data_._1_3_,iVar1 != 0);
          local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_e8,(internal *)&local_100,
                       (AssertionResult *)
                       "ec_point_mul_scalar_public(group(), &ret->raw, &sc32, &p->raw, &sc31)",
                       "false","true",pcVar2);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3ab,(char *)CONCAT44(local_e8._4_4_,local_e8._0_4_));
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_f0);
            goto LAB_002dceb0;
          }
          local_100.data_._0_4_ = 0;
          local_f0.data_._0_4_ =
               EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                            (EC_POINT *)local_c0._M_head_impl,src,(BN_CTX *)0x0);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_e8,"0","EC_POINT_cmp(group(), ret.get(), g, nullptr)",
                     (int *)&local_100,(int *)&local_f0);
          if (local_e8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_100);
            if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_e0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x3ac,pcVar2);
            testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_100);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            if ((long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_100.data_._4_4_,local_100.data_._0_4_) + 8))();
            }
          }
          if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_e0;
            goto LAB_002dcbd6;
          }
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_28);
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_20);
      }
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_c0);
      goto LAB_002dcbff;
    }
    testing::Message::Message((Message *)local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_70,
               (AssertionResult *)"EC_POINT_invert(group(), p.get(), nullptr)","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x397,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
    testing::internal::AssertHelper::operator=(&local_100,(Message *)local_e8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8[0]._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 8))();
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
LAB_002dcbff:
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST_P(ECCurveTest, P224Bug) {
  // P = -G
  const EC_POINT *g = EC_GROUP_get0_generator(group());
  bssl::UniquePtr<EC_POINT> p(EC_POINT_dup(g, group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_invert(group(), p.get(), nullptr));

  // Compute 31 * P + 32 * G = G
  bssl::UniquePtr<EC_POINT> ret(EC_POINT_new(group()));
  ASSERT_TRUE(ret);
  bssl::UniquePtr<BIGNUM> bn31(BN_new()), bn32(BN_new());
  ASSERT_TRUE(bn31);
  ASSERT_TRUE(bn32);
  ASSERT_TRUE(BN_set_word(bn31.get(), 31));
  ASSERT_TRUE(BN_set_word(bn32.get(), 32));
  ASSERT_TRUE(EC_POINT_mul(group(), ret.get(), bn32.get(), p.get(), bn31.get(),
                           nullptr));
  EXPECT_EQ(0, EC_POINT_cmp(group(), ret.get(), g, nullptr));

  // Repeat the computation with |ec_point_mul_scalar_public|, which ties the
  // additions together.
  EC_SCALAR sc31, sc32;
  ASSERT_TRUE(ec_bignum_to_scalar(group(), &sc31, bn31.get()));
  ASSERT_TRUE(ec_bignum_to_scalar(group(), &sc32, bn32.get()));
  ASSERT_TRUE(
      ec_point_mul_scalar_public(group(), &ret->raw, &sc32, &p->raw, &sc31));
  EXPECT_EQ(0, EC_POINT_cmp(group(), ret.get(), g, nullptr));
}